

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O0

int NAME_CONSTRAINTS_check(X509 *x,NAME_CONSTRAINTS *nc)

{
  int iVar1;
  X509_NAME *name;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  X509_NAME_ENTRY *ne_00;
  X509_NAME *pXVar6;
  GENERAL_NAME *gen_00;
  GENERAL_NAME *gen;
  X509_NAME_ENTRY *ne;
  GENERAL_NAME gntmp;
  size_t check_count;
  size_t constraint_count;
  size_t name_count;
  X509_NAME *nm;
  size_t j;
  int i;
  int r;
  NAME_CONSTRAINTS *nc_local;
  X509 *x_local;
  
  name = X509_get_subject_name(x);
  iVar1 = X509_NAME_entry_count(name);
  sVar2 = sk_GENERAL_NAME_num((stack_st_GENERAL_NAME *)x->ex_xkusage);
  uVar3 = (long)iVar1 + sVar2;
  sVar2 = sk_GENERAL_SUBTREE_num((stack_st_GENERAL_SUBTREE *)nc->permittedSubtrees);
  sVar4 = sk_GENERAL_SUBTREE_num((stack_st_GENERAL_SUBTREE *)nc->excludedSubtrees);
  uVar5 = sVar2 + sVar4;
  gntmp.d.ptr = (char *)(uVar5 * uVar3);
  iVar1 = X509_NAME_entry_count(name);
  if ((((uVar3 < (ulong)(long)iVar1) ||
       (sVar2 = sk_GENERAL_SUBTREE_num((stack_st_GENERAL_SUBTREE *)nc->permittedSubtrees),
       uVar5 < sVar2)) || ((uVar5 != 0 && ((ulong)gntmp.d.ptr / uVar5 != uVar3)))) ||
     (std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_S_max_size.e_ident_magic_str <=
      gntmp.d.ptr)) {
    x_local._4_4_ = 1;
  }
  else {
    iVar1 = X509_NAME_entry_count(name);
    if (iVar1 < 1) {
LAB_0076c757:
      for (nm = (X509_NAME *)0x0;
          pXVar6 = (X509_NAME *)sk_GENERAL_NAME_num((stack_st_GENERAL_NAME *)x->ex_xkusage),
          nm < pXVar6; nm = (X509_NAME *)((long)&nm->entries + 1)) {
        gen_00 = sk_GENERAL_NAME_value((stack_st_GENERAL_NAME *)x->ex_xkusage,(size_t)nm);
        iVar1 = nc_match(gen_00,(NAME_CONSTRAINTS *)nc);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      x_local._4_4_ = 0;
    }
    else {
      ne._0_4_ = 4;
      gntmp._0_8_ = name;
      x_local._4_4_ = nc_match((GENERAL_NAME *)&ne,(NAME_CONSTRAINTS *)nc);
      if (x_local._4_4_ == 0) {
        ne._0_4_ = 1;
        j._0_4_ = -1;
        do {
          j._0_4_ = X509_NAME_get_index_by_NID(name,0x30,(int)j);
          if ((int)j == -1) goto LAB_0076c757;
          ne_00 = X509_NAME_get_entry(name,(int)j);
          gntmp._0_8_ = X509_NAME_ENTRY_get_data(ne_00);
          if (((ASN1_STRING *)gntmp._0_8_)->type != 0x16) {
            return 0x35;
          }
          x_local._4_4_ = nc_match((GENERAL_NAME *)&ne,(NAME_CONSTRAINTS *)nc);
        } while (x_local._4_4_ == 0);
      }
    }
  }
  return x_local._4_4_;
}

Assistant:

int NAME_CONSTRAINTS_check(X509 *x, NAME_CONSTRAINTS *nc) {
  int r, i;
  size_t j;
  X509_NAME *nm;

  nm = X509_get_subject_name(x);

  // Guard against certificates with an excessive number of names or
  // constraints causing a computationally expensive name constraints
  // check.
  size_t name_count =
      X509_NAME_entry_count(nm) + sk_GENERAL_NAME_num(x->altname);
  size_t constraint_count = sk_GENERAL_SUBTREE_num(nc->permittedSubtrees) +
                            sk_GENERAL_SUBTREE_num(nc->excludedSubtrees);
  size_t check_count = constraint_count * name_count;
  if (name_count < (size_t)X509_NAME_entry_count(nm) ||
      constraint_count < sk_GENERAL_SUBTREE_num(nc->permittedSubtrees) ||
      (constraint_count && check_count / constraint_count != name_count) ||
      check_count > 1 << 20) {
    return X509_V_ERR_UNSPECIFIED;
  }

  if (X509_NAME_entry_count(nm) > 0) {
    GENERAL_NAME gntmp;
    gntmp.type = GEN_DIRNAME;
    gntmp.d.directoryName = nm;

    r = nc_match(&gntmp, nc);

    if (r != X509_V_OK) {
      return r;
    }

    gntmp.type = GEN_EMAIL;

    // Process any email address attributes in subject name

    for (i = -1;;) {
      i = X509_NAME_get_index_by_NID(nm, NID_pkcs9_emailAddress, i);
      if (i == -1) {
        break;
      }
      const X509_NAME_ENTRY *ne = X509_NAME_get_entry(nm, i);
      gntmp.d.rfc822Name = X509_NAME_ENTRY_get_data(ne);
      if (gntmp.d.rfc822Name->type != V_ASN1_IA5STRING) {
        return X509_V_ERR_UNSUPPORTED_NAME_SYNTAX;
      }

      r = nc_match(&gntmp, nc);

      if (r != X509_V_OK) {
        return r;
      }
    }
  }

  for (j = 0; j < sk_GENERAL_NAME_num(x->altname); j++) {
    GENERAL_NAME *gen = sk_GENERAL_NAME_value(x->altname, j);
    r = nc_match(gen, nc);
    if (r != X509_V_OK) {
      return r;
    }
  }

  return X509_V_OK;
}